

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O2

void __thiscall Assimp::Blender::DNAParser::Parse(DNAParser *this)

{
  vector<Assimp::Blender::Structure> *this_00;
  pointer out;
  FileDatabase *pFVar1;
  StreamReaderAny *stream;
  pointer pSVar2;
  pointer pSVar3;
  pointer pFVar4;
  char *pcVar5;
  pointer pFVar6;
  pointer pFVar7;
  pointer pTVar8;
  pointer pbVar9;
  bool bVar10;
  char cVar11;
  short sVar12;
  ushort uVar13;
  int iVar14;
  mapped_type_conflict3 *pmVar15;
  long lVar16;
  Logger *this_01;
  DeadlyImportError *pDVar17;
  Type *s;
  pointer pbVar18;
  pointer pTVar19;
  size_type sVar20;
  ulong __n;
  vector<Type,_std::allocator<Type>_> types;
  string local_230;
  size_t local_210;
  DNA *local_208;
  long local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  pointer pFStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_150;
  size_t local_148;
  size_t local_138;
  
  pFVar1 = this->db;
  stream = (pFVar1->reader).
           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar10 = match4(stream,"SDNA");
  if (!bVar10) {
    pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"BlenderDNA: Expected SDNA chunk",(allocator<char> *)&local_230);
    DeadlyImportError::DeadlyImportError(pDVar17,(string *)local_1a8);
    __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar10 = match4(stream,"NAME");
  if (!bVar10) {
    pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"BlenderDNA: Expected NAME field",(allocator<char> *)&local_230);
    DeadlyImportError::DeadlyImportError(pDVar17,(string *)local_1a8);
    __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar14 = StreamReader<true,_true>::Get<int>(stream);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&names,(long)iVar14,(allocator_type *)local_1a8);
  pbVar9 = names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_208 = &pFVar1->dna;
  for (pbVar18 = names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar9; pbVar18 = pbVar18 + 1
      ) {
    while (cVar11 = StreamReader<true,_true>::Get<signed_char>(stream), cVar11 != '\0') {
      ::std::__cxx11::string::push_back((char)pbVar18);
    }
  }
  while ((*(int *)&stream->current - *(int *)&stream->buffer & 3U) != 0) {
    StreamReader<true,_true>::Get<signed_char>(stream);
  }
  bVar10 = match4(stream,"TYPE");
  if (!bVar10) {
    pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"BlenderDNA: Expected TYPE field",(allocator<char> *)&local_230);
    DeadlyImportError::DeadlyImportError(pDVar17,(string *)local_1a8);
    __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar14 = StreamReader<true,_true>::Get<int>(stream);
  ::std::vector<Type,_std::allocator<Type>_>::vector
            (&types,(long)iVar14,(allocator_type *)local_1a8);
  pTVar8 = types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pTVar19 = types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                 super__Vector_impl_data._M_start; pTVar19 != pTVar8; pTVar19 = pTVar19 + 1) {
    while (cVar11 = StreamReader<true,_true>::Get<signed_char>(stream), cVar11 != '\0') {
      ::std::__cxx11::string::push_back((char)pTVar19 + '\b');
    }
  }
  while ((*(int *)&stream->current - *(int *)&stream->buffer & 3U) != 0) {
    StreamReader<true,_true>::Get<signed_char>(stream);
  }
  bVar10 = match4(stream,"TLEN");
  pTVar8 = types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pTVar19 = types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (bVar10) {
    for (; pTVar19 != pTVar8; pTVar19 = pTVar19 + 1) {
      sVar12 = StreamReader<true,_true>::Get<short>(stream);
      pTVar19->size = (long)sVar12;
    }
    while ((*(int *)&stream->current - *(int *)&stream->buffer & 3U) != 0) {
      StreamReader<true,_true>::Get<signed_char>(stream);
    }
    bVar10 = match4(stream,"STRC");
    if (!bVar10) {
      pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,"BlenderDNA: Expected STRC field",(allocator<char> *)&local_230
                );
      DeadlyImportError::DeadlyImportError(pDVar17,(string *)local_1a8);
      __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar14 = StreamReader<true,_true>::Get<int>(stream);
    this_00 = &(pFVar1->dna).structures;
    ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::reserve
              (&this_00->
                super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               ,(long)iVar14);
    local_200 = 0;
    sVar20 = 0;
    do {
      if (sVar20 == (long)iVar14) {
        this_01 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[17]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [17])"BlenderDNA: Got ");
        ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        ::std::operator<<((ostream *)local_1a8," structures with totally ");
        ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        ::std::operator<<((ostream *)local_1a8," fields");
        ::std::__cxx11::stringbuf::str();
        Logger::debug(this_01,local_230._M_dataplus._M_p);
        ::std::__cxx11::string::~string((string *)&local_230);
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        DNA::DumpToFile(local_208);
        DNA::AddPrimitiveStructures(local_208);
        DNA::RegisterConverters(local_208);
        ::std::vector<Type,_std::allocator<Type>_>::~vector(&types);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&names);
        return;
      }
      uVar13 = StreamReader<true,_true>::Get<short>(stream);
      if ((ulong)(((long)types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x28) <= (ulong)uVar13) {
        pDVar17 = (DeadlyImportError *)
                  __cxa_allocate_exception
                            (0x10,0x28,
                             ((long)types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                                   super__Vector_impl_data._M_start) % 0x28);
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::operator<<((ostream *)local_1a8,"BlenderDNA: Invalid type index in structure name");
        ::std::ostream::operator<<(local_1a8,uVar13);
        ::std::operator<<((ostream *)local_1a8," (there are only ");
        ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        ::std::operator<<((ostream *)local_1a8," entries)");
        ::std::__cxx11::stringbuf::str();
        DeadlyImportError::DeadlyImportError(pDVar17,&local_230);
        __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar2 = (pFVar1->dna).structures.
               super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               .
               super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (pFVar1->dna).structures.
               super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               .
               super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pmVar15 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::operator[](&(pFVar1->dna).indices,
                             &types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar13].name);
      *pmVar15 = ((long)pSVar3 - (long)pSVar2) / 0x78;
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
      local_178._M_allocated_capacity = 0;
      local_188._M_p = (pointer)0x0;
      pFStack_180 = (pointer)0x0;
      local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffff00000000;
      local_168._8_8_ = 0;
      local_158 = &local_168;
      local_148 = 0;
      local_138 = 0xffffffffffffffff;
      paStack_150 = local_158;
      ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
      emplace_back<Assimp::Blender::Structure>
                (&this_00->
                  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                 ,(Structure *)local_1a8);
      Structure::~Structure((Structure *)local_1a8);
      pSVar2 = (pFVar1->dna).structures.
               super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               .
               super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_assign((string *)(pSVar2 + -1));
      uVar13 = StreamReader<true,_true>::Get<short>(stream);
      __n = (ulong)uVar13;
      ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::reserve
                (&pSVar2[-1].fields.
                  super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>,__n)
      ;
      local_200 = local_200 + __n;
      local_210 = 0;
      while( true ) {
        bVar10 = __n == 0;
        __n = __n - 1;
        if (bVar10) break;
        uVar13 = StreamReader<true,_true>::Get<short>(stream);
        if ((ulong)(((long)types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x28) <= (ulong)uVar13) {
          pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::operator<<((ostream *)local_1a8,
                            "BlenderDNA: Invalid type index in structure field ");
          ::std::ostream::operator<<(local_1a8,uVar13);
          ::std::operator<<((ostream *)local_1a8," (there are only ");
          ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          ::std::operator<<((ostream *)local_1a8," entries)");
          ::std::__cxx11::stringbuf::str();
          DeadlyImportError::DeadlyImportError(pDVar17,&local_230);
          __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        paStack_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_168._M_allocated_capacity = 0;
        local_168._8_8_ = 0;
        local_178._8_8_ = 0;
        pFStack_180 = (pointer)0x0;
        local_1a8._16_8_ = 0;
        local_1a8._24_8_ = 0;
        local_148 = 0;
        local_1a8._8_8_ = 0;
        local_188._M_p = (pointer)&local_178;
        local_178._M_allocated_capacity = 0;
        ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::
        emplace_back<Assimp::Blender::Field>
                  (&pSVar2[-1].fields.
                    super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>,
                   (Field *)local_1a8);
        Field::~Field((Field *)local_1a8);
        pFVar4 = pSVar2[-1].fields.
                 super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
                 super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pFVar4[-1].offset = local_210;
        ::std::__cxx11::string::_M_assign((string *)&pFVar4[-1].type);
        pFVar4[-1].size =
             types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar13].size;
        uVar13 = StreamReader<true,_true>::Get<short>(stream);
        if ((ulong)((long)names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar13) {
          pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::operator<<((ostream *)local_1a8,
                            "BlenderDNA: Invalid name index in structure field ");
          ::std::ostream::operator<<(local_1a8,uVar13);
          ::std::operator<<((ostream *)local_1a8," (there are only ");
          ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          ::std::operator<<((ostream *)local_1a8," entries)");
          ::std::__cxx11::stringbuf::str();
          DeadlyImportError::DeadlyImportError(pDVar17,&local_230);
          __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
        }
        out = pFVar4 + -1;
        ::std::__cxx11::string::_M_assign((string *)out);
        pFVar4[-1].flags = 0;
        pcVar5 = pFVar4[-1].name._M_dataplus._M_p;
        if (*pcVar5 == '*') {
          pFVar4[-1].size = (ulong)this->db->i64bit * 4 + 4;
          pFVar4[-1].flags = 1;
        }
        if (pcVar5[pFVar4[-1].name._M_string_length - 1] == ']') {
          lVar16 = ::std::__cxx11::string::find((char)out,0x5b);
          if (lVar16 == -1) {
            pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::operator<<((ostream *)local_1a8,
                              "BlenderDNA: Encountered invalid array declaration ");
            ::std::operator<<((ostream *)local_1a8,(string *)out);
            ::std::__cxx11::stringbuf::str();
            DeadlyImportError::DeadlyImportError(pDVar17,&local_230);
            __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
          }
          *(byte *)&pFVar4[-1].flags = (byte)pFVar4[-1].flags | 2;
          DNA::ExtractArraySize(&out->name,pFVar4[-1].array_sizes);
          ::std::__cxx11::string::substr((ulong)local_1a8,(ulong)out);
          ::std::__cxx11::string::operator=((string *)out,(string *)local_1a8);
          ::std::__cxx11::string::~string((string *)local_1a8);
          pFVar4[-1].size = pFVar4[-1].array_sizes[1] * pFVar4[-1].array_sizes[0] * pFVar4[-1].size;
        }
        pFVar6 = pSVar2[-1].fields.
                 super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
                 super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar7 = pSVar2[-1].fields.
                 super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
                 super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pmVar15 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::operator[](&pSVar2[-1].indices,&out->name);
        *pmVar15 = ((long)pFVar7 - (long)pFVar6) / 0x68 - 1;
        local_210 = local_210 + pFVar4[-1].size;
      }
      pSVar2[-1].size = local_210;
      sVar20 = sVar20 + 1;
    } while( true );
  }
  pDVar17 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"BlenderDNA: Expected TLEN field",(allocator<char> *)&local_230);
  DeadlyImportError::DeadlyImportError(pDVar17,(string *)local_1a8);
  __cxa_throw(pDVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DNAParser::Parse ()
{
    StreamReaderAny& stream = *db.reader.get();
    DNA& dna = db.dna;

    if(!match4(stream,"SDNA")) {
        throw DeadlyImportError("BlenderDNA: Expected SDNA chunk");
    }

    // name dictionary
    if(!match4(stream,"NAME")) {
        throw DeadlyImportError("BlenderDNA: Expected NAME field");
    }

    std::vector<std::string> names (stream.GetI4());
    for(std::string& s : names) {
        while (char c = stream.GetI1()) {
            s += c;
        }
    }

    // type dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"TYPE")) {
        throw DeadlyImportError("BlenderDNA: Expected TYPE field");
    }

    std::vector<Type> types (stream.GetI4());
    for(Type& s : types) {
        while (char c = stream.GetI1()) {
            s.name += c;
        }
    }

    // type length dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"TLEN")) {
        throw DeadlyImportError("BlenderDNA: Expected TLEN field");
    }

    for(Type& s : types) {
        s.size = stream.GetI2();
    }

    // structures dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"STRC")) {
        throw DeadlyImportError("BlenderDNA: Expected STRC field");
    }

    size_t end = stream.GetI4(), fields = 0;

    dna.structures.reserve(end);
    for(size_t i = 0; i != end; ++i) {

        uint16_t n = stream.GetI2();
        if (n >= types.size()) {
            throw DeadlyImportError((format(),
                "BlenderDNA: Invalid type index in structure name" ,n,
                " (there are only ", types.size(), " entries)"
            ));
        }

        // maintain separate indexes
        dna.indices[types[n].name] = dna.structures.size();

        dna.structures.push_back(Structure());
        Structure& s = dna.structures.back();
        s.name  = types[n].name;
        //s.index = dna.structures.size()-1;

        n = stream.GetI2();
        s.fields.reserve(n);

        size_t offset = 0;
        for (size_t m = 0; m < n; ++m, ++fields) {

            uint16_t j = stream.GetI2();
            if (j >= types.size()) {
                throw DeadlyImportError((format(),
                    "BlenderDNA: Invalid type index in structure field ", j,
                    " (there are only ", types.size(), " entries)"
                ));
            }
            s.fields.push_back(Field());
            Field& f = s.fields.back();
            f.offset = offset;

            f.type = types[j].name;
            f.size = types[j].size;

            j = stream.GetI2();
            if (j >= names.size()) {
                throw DeadlyImportError((format(),
                    "BlenderDNA: Invalid name index in structure field ", j,
                    " (there are only ", names.size(), " entries)"
                ));
            }

            f.name = names[j];
            f.flags = 0u;

            // pointers always specify the size of the pointee instead of their own.
            // The pointer asterisk remains a property of the lookup name.
            if (f.name[0] == '*') {
                f.size = db.i64bit ? 8 : 4;
                f.flags |= FieldFlag_Pointer;
            }

            // arrays, however, specify the size of a single element so we
            // need to parse the (possibly multi-dimensional) array declaration
            // in order to obtain the actual size of the array in the file.
            // Also we need to alter the lookup name to include no array
            // brackets anymore or size fixup won't work (if our size does
            // not match the size read from the DNA).
            if (*f.name.rbegin() == ']') {
                const std::string::size_type rb = f.name.find('[');
                if (rb == std::string::npos) {
                    throw DeadlyImportError((format(),
                        "BlenderDNA: Encountered invalid array declaration ",
                        f.name
                    ));
                }

                f.flags |= FieldFlag_Array;
                DNA::ExtractArraySize(f.name,f.array_sizes);
                f.name = f.name.substr(0,rb);

                f.size *= f.array_sizes[0] * f.array_sizes[1];
            }

            // maintain separate indexes
            s.indices[f.name] = s.fields.size()-1;
            offset += f.size;
        }
        s.size = offset;
    }

    ASSIMP_LOG_DEBUG_F( "BlenderDNA: Got ", dna.structures.size()," structures with totally ",fields," fields");

#ifdef ASSIMP_BUILD_BLENDER_DEBUG
    dna.DumpToFile();
#endif

    dna.AddPrimitiveStructures();
    dna.RegisterConverters();
}